

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O2

void __thiscall TCLAP::CmdLine::add(CmdLine *this,Arg *a)

{
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *plVar1;
  int iVar2;
  SpecificationException *this_00;
  _List_node_base *p_Var3;
  allocator local_8a;
  allocator local_89;
  string local_88 [32];
  string local_68;
  string local_48;
  
  plVar1 = &this->_argList;
  p_Var3 = (_List_node_base *)plVar1;
  do {
    p_Var3 = (((_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)&p_Var3->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)plVar1) {
      (*a->_vptr_Arg[2])(a,plVar1);
      iVar2 = (*a->_vptr_Arg[5])(a);
      if ((char)iVar2 != '\0') {
        this->_numRequired = this->_numRequired + 1;
      }
      return;
    }
    iVar2 = (*a->_vptr_Arg[4])(a,p_Var3[1]._M_next);
  } while ((char)iVar2 == '\0');
  this_00 = (SpecificationException *)__cxa_allocate_exception(0x68);
  std::__cxx11::string::string
            ((string *)&local_48,"Argument with same flag/name already exists!",&local_89);
  std::__cxx11::string::string(local_88,"val",&local_8a);
  (*a->_vptr_Arg[9])(&local_68,a,local_88);
  SpecificationException::SpecificationException(this_00,&local_48,&local_68);
  __cxa_throw(this_00,&SpecificationException::typeinfo,ArgException::~ArgException);
}

Assistant:

inline void CmdLine::add( Arg* a )
{
	for( ArgListIterator it = _argList.begin(); it != _argList.end(); it++ )
		if ( *a == *(*it) )
			throw( SpecificationException(
			        "Argument with same flag/name already exists!",
			        a->longID() ) );

	a->addToList( _argList );

	if ( a->isRequired() )
		_numRequired++;
}